

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O1

void __thiscall
RTree::get_polygons_JSON(RTree *this,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *ans,string *json)

{
  uint uVar1;
  uint uVar2;
  vector<d_leaf_*,_std::allocator<d_leaf_*>_> *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  vector<Point,_std::allocator<Point>_> local_50;
  vector<d_leaf_*,_std::allocator<d_leaf_*>_> *local_38;
  
  std::__cxx11::string::append((char *)json);
  if ((ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar8 = 0;
    local_38 = ans;
    do {
      std::__cxx11::string::append((char *)json);
      if (0 < (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8]->polygon->corners) {
        uVar9 = 0;
        do {
          std::__cxx11::string::append((char *)json);
          Polygon::get_vertices
                    (&local_50,
                     (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar8]->polygon);
          uVar1 = local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9].X;
          uVar2 = -uVar1;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar7 = 1;
          if (9 < uVar2) {
            uVar6 = (ulong)uVar2;
            uVar4 = 4;
            do {
              uVar7 = uVar4;
              uVar5 = (uint)uVar6;
              if (uVar5 < 100) {
                uVar7 = uVar7 - 2;
                goto LAB_00107204;
              }
              if (uVar5 < 1000) {
                uVar7 = uVar7 - 1;
                goto LAB_00107204;
              }
              if (uVar5 < 10000) goto LAB_00107204;
              uVar6 = uVar6 / 10000;
              uVar4 = uVar7 + 4;
            } while (99999 < uVar5);
            uVar7 = uVar7 + 1;
          }
LAB_00107204:
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct
                    ((ulong)local_70,(char)uVar7 - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_70[0]),uVar7,uVar2);
          std::__cxx11::string::_M_append((char *)json,(ulong)local_70[0]);
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          pvVar3 = local_38;
          if (local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          std::__cxx11::string::append((char *)json);
          Polygon::get_vertices
                    (&local_50,
                     (pvVar3->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar8]->polygon);
          uVar1 = local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9].Y;
          uVar2 = -uVar1;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar7 = 1;
          if (9 < uVar2) {
            uVar6 = (ulong)uVar2;
            uVar4 = 4;
            do {
              uVar7 = uVar4;
              uVar5 = (uint)uVar6;
              if (uVar5 < 100) {
                uVar7 = uVar7 - 2;
                goto LAB_00107308;
              }
              if (uVar5 < 1000) {
                uVar7 = uVar7 - 1;
                goto LAB_00107308;
              }
              if (uVar5 < 10000) goto LAB_00107308;
              uVar6 = uVar6 / 10000;
              uVar4 = uVar7 + 4;
            } while (99999 < uVar5);
            uVar7 = uVar7 + 1;
          }
LAB_00107308:
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct
                    ((ulong)local_70,(char)uVar7 - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_70[0]),uVar7,uVar2);
          std::__cxx11::string::_M_append((char *)json,(ulong)local_70[0]);
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          ans = local_38;
          if (local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          std::__cxx11::string::append((char *)json);
          uVar9 = uVar9 + 1;
          if (uVar9 != (uint)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar8]->polygon->corners) {
            std::__cxx11::string::append((char *)json);
          }
        } while ((long)uVar9 <
                 (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar8]->polygon->corners);
      }
      std::__cxx11::string::append((char *)json);
      uVar8 = uVar8 + 1;
      if ((long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != uVar8) {
        std::__cxx11::string::append((char *)json);
      }
    } while (uVar8 < (ulong)((long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__cxx11::string::append((char *)json);
  return;
}

Assistant:

void RTree::get_polygons_JSON(const std::vector<d_leaf*> & ans,std::string &json){
    json += "[";
    for(int i=0; i<ans.size(); i++){
        json +="[";    
        for(int j = 0; j < ans[i]->polygon->corners;j++){
           json +="[";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_X());
           json += ",";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_Y()); 
           json +="]";
           if((j+1) != ans[i]->polygon->corners)
                json +=",";
        }
        json +="]";
        if((i+1) != ans.size())
            json +=",";
    }
    json += "]";
}